

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

char * glfwGetKeyName(int key,int scancode)

{
  int in_EDI;
  undefined8 in_stack_fffffffffffffff8;
  char *pcVar1;
  int scancode_00;
  
  scancode_00 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    pcVar1 = (char *)0x0;
  }
  else {
    if (in_EDI != -1) {
      if (((in_EDI != 0x150) && ((in_EDI < 0x140 || (0x14e < in_EDI)))) &&
         ((in_EDI < 0x27 || (0xa2 < in_EDI)))) {
        return (char *)0x0;
      }
      _glfwPlatformGetKeyScancode(in_EDI);
    }
    pcVar1 = _glfwPlatformGetScancodeName(scancode_00);
  }
  return pcVar1;
}

Assistant:

GLFWAPI const char* glfwGetKeyName(int key, int scancode)
{
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (key != GLFW_KEY_UNKNOWN)
    {
        if (key != GLFW_KEY_KP_EQUAL &&
            (key < GLFW_KEY_KP_0 || key > GLFW_KEY_KP_ADD) &&
            (key < GLFW_KEY_APOSTROPHE || key > GLFW_KEY_WORLD_2))
        {
            return NULL;
        }

        scancode = _glfwPlatformGetKeyScancode(key);
    }

    return _glfwPlatformGetScancodeName(scancode);
}